

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::defineVariable(Kvm *this,Value *var,Value *val,Value *env)

{
  Value *frame_00;
  Value *pVVar1;
  Value *local_48;
  Value *values;
  Value *variables;
  Value *frame;
  Value *env_local;
  Value *val_local;
  Value *var_local;
  Kvm *this_local;
  
  frame_00 = firstFrame(this,env);
  values = frameVariables(this,frame_00);
  local_48 = frameValues(this,frame_00);
  while( true ) {
    if (values == this->NIL) {
      addBindingToFrame(this,var,val,frame_00);
      return var;
    }
    pVVar1 = car(values);
    if (var == pVVar1) break;
    values = cdr(values);
    local_48 = cdr(local_48);
  }
  set_car(local_48,val);
  return var;
}

Assistant:

const Value * Kvm::defineVariable(const Value *var, const Value *val, const Value *env)
{
    auto frame = firstFrame(env);
    auto variables = frameVariables(frame);
    auto values = frameValues(frame);
    while (variables != NIL)
    {
        if (var == car(variables))
        {
            set_car(const_cast<Value *>(values), val);
            return var;
        }
        variables = cdr(variables);
        values = cdr(values);
    }
    addBindingToFrame(var, val, frame);
    return var;
}